

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbwrapper_tests.cpp
# Opt level: O3

void __thiscall dbwrapper_tests::existing_data_reindex::test_method(existing_data_reindex *this)

{
  long lVar1;
  pointer puVar2;
  pointer puVar3;
  unique_ptr<CDBWrapper,_std::default_delete<CDBWrapper>_> this_00;
  char cVar4;
  readonly_property<bool> rVar5;
  byte bVar6;
  int iVar7;
  __uniq_ptr_data<CDBWrapper,_std::default_delete<CDBWrapper>,_true,_true> this_01;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar8;
  ulong uVar9;
  iterator in_R8;
  iterator pvVar10;
  iterator in_R9;
  iterator pvVar11;
  FastRandomContext *this_02;
  long in_FS_OFFSET;
  bool bVar12;
  Span<std::byte> output;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  Span<std::byte> output_00;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  check_type cVar13;
  undefined1 local_400 [16];
  undefined1 *local_3f0;
  char *local_3e8;
  undefined1 *local_3e0;
  undefined1 *local_3d8;
  char *local_3d0;
  char *local_3c8;
  char *local_3c0;
  char *local_3b8;
  undefined1 *local_3b0;
  undefined1 *local_3a8;
  char *local_3a0;
  char *local_398;
  char *local_390;
  char *local_388;
  undefined1 *local_380;
  undefined1 *local_378;
  char *local_370;
  char *local_368;
  char *local_360;
  char *local_358;
  undefined1 *local_350;
  undefined1 *local_348;
  char *local_340;
  char *local_338;
  char *local_330;
  char *local_328;
  undefined1 *local_320;
  undefined1 *local_318;
  char *local_310;
  char *local_308;
  undefined1 *local_300;
  undefined1 *local_2f8;
  char *local_2f0;
  char *local_2e8;
  char *local_2e0;
  char *local_2d8;
  undefined1 *local_2d0;
  undefined1 *local_2c8;
  char *local_2c0;
  char *local_2b8;
  char *local_2b0;
  char *local_2a8;
  undefined1 *local_2a0;
  undefined1 *local_298;
  char *local_290;
  char *local_288;
  uint8_t key;
  unique_ptr<CDBWrapper,_std::default_delete<CDBWrapper>_> dbw;
  string *local_270;
  assertion_result local_268;
  string **local_250;
  string *local_248;
  char *local_240;
  char *local_238;
  assertion_result local_230;
  undefined1 local_218 [32];
  undefined1 local_1f8 [32];
  uint256 res3;
  undefined1 local_1b0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_1a0;
  size_t local_188;
  undefined4 local_180;
  CDBWrapper odbw;
  uint256 in2;
  uint256 res2;
  uint256 res;
  uint256 in;
  path local_88;
  path ph;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ArgsManager::GetDataDir
            ((path *)&local_88,&(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).m_args,false);
  std::filesystem::__cxx11::path::_M_append(&local_88,0x15,"existing_data_reindex");
  std::filesystem::__cxx11::path::path(&ph.super_path,&local_88);
  std::filesystem::__cxx11::path::~path(&local_88);
  cVar4 = std::filesystem::symlink_status((path *)&ph.super_path);
  if (cVar4 == '\x03') {
    cVar4 = std::filesystem::status((path *)&ph);
    if (cVar4 == '\x02') goto LAB_00380159;
  }
  std::filesystem::create_directories((path *)&ph);
LAB_00380159:
  std::filesystem::__cxx11::path::path((path *)&odbw,&ph.super_path);
  odbw.obfuscate_key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x400;
  odbw.obfuscate_key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0;
  this_01.super___uniq_ptr_impl<CDBWrapper,_std::default_delete<CDBWrapper>_>._M_t.
  super__Tuple_impl<0UL,_CDBWrapper_*,_std::default_delete<CDBWrapper>_>.
  super__Head_base<0UL,_CDBWrapper_*,_false>._M_head_impl =
       (__uniq_ptr_impl<CDBWrapper,_std::default_delete<CDBWrapper>_>)operator_new(0x70);
  CDBWrapper::CDBWrapper
            ((CDBWrapper *)
             this_01.super___uniq_ptr_impl<CDBWrapper,_std::default_delete<CDBWrapper>_>._M_t.
             super__Tuple_impl<0UL,_CDBWrapper_*,_std::default_delete<CDBWrapper>_>.
             super__Head_base<0UL,_CDBWrapper_*,_false>._M_head_impl,(DBParams *)&odbw);
  dbw._M_t.super___uniq_ptr_impl<CDBWrapper,_std::default_delete<CDBWrapper>_>._M_t.
  super__Tuple_impl<0UL,_CDBWrapper_*,_std::default_delete<CDBWrapper>_>.
  super__Head_base<0UL,_CDBWrapper_*,_false>._M_head_impl =
       (__uniq_ptr_data<CDBWrapper,_std::default_delete<CDBWrapper>,_true,_true>)
       (__uniq_ptr_data<CDBWrapper,_std::default_delete<CDBWrapper>,_true,_true>)
       this_01.super___uniq_ptr_impl<CDBWrapper,_std::default_delete<CDBWrapper>_>._M_t.
       super__Tuple_impl<0UL,_CDBWrapper_*,_std::default_delete<CDBWrapper>_>.
       super__Head_base<0UL,_CDBWrapper_*,_false>._M_head_impl;
  std::filesystem::__cxx11::path::~path((path *)&odbw);
  key = 'k';
  this_02 = &(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).m_rng;
  in.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  in.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  in.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  in.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  in.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  in.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  in.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  in.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  in.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  in.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  in.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  in.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  in.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  in.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  in.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  in.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  in.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  in.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  in.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  in.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  in.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  in.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  in.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  in.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  in.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  in.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  in.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  in.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  in.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  in.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  in.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  in.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  output.m_size = 0x20;
  output.m_data = (byte *)&in;
  FastRandomContext::fillrand(this_02,output);
  res.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  res.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  res.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  res.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  res.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  res.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  res.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  res.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  res.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  res.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  res.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  res.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  res.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  res.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  res.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  res.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  res.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  res.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  res.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  res.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  res.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  res.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  res.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  res.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  res.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  res.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  res.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  res.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  res.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  res.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  res.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  res.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  local_290 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/dbwrapper_tests.cpp"
  ;
  local_288 = "";
  local_2a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_298 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x103;
  file.m_begin = (iterator)&local_290;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_2a0,msg);
  _cVar13 = 0x380262;
  rVar5.super_class_property<bool>.value =
       (class_property<bool>)
       CDBWrapper::Write<unsigned_char,uint256>
                 ((CDBWrapper *)
                  dbw._M_t.super___uniq_ptr_impl<CDBWrapper,_std::default_delete<CDBWrapper>_>._M_t.
                  super__Tuple_impl<0UL,_CDBWrapper_*,_std::default_delete<CDBWrapper>_>.
                  super__Head_base<0UL,_CDBWrapper_*,_false>._M_head_impl,&key,&in,false);
  local_1b0._8_8_ = (element_type *)0x0;
  aStack_1a0._M_allocated_capacity = 0;
  local_268._0_8_ = "dbw->Write(key, in)";
  local_268.m_message.px = (element_type *)0xe5d4b6;
  odbw.m_name._M_dataplus._M_p._0_1_ = 0;
  odbw.m_db_context._M_t.super___uniq_ptr_impl<LevelDBContext,_std::default_delete<LevelDBContext>_>
  ._M_t.super__Tuple_impl<0UL,_LevelDBContext_*,_std::default_delete<LevelDBContext>_>.
  super__Head_base<0UL,_LevelDBContext_*,_false>._M_head_impl =
       (__uniq_ptr_data<LevelDBContext,_std::default_delete<LevelDBContext>,_true,_true>)
       &PTR__lazy_ostream_01389048;
  odbw.m_name._M_string_length = (size_type)boost::unit_test::lazy_ostream::inst;
  local_2b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/dbwrapper_tests.cpp"
  ;
  local_2a8 = "";
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x0;
  odbw.m_name.field_2._M_allocated_capacity = (size_type)&local_268;
  local_1b0[0] = rVar5.super_class_property<bool>.value;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_1b0,(lazy_ostream *)&odbw,1,0,WARN,_cVar13,(size_t)&local_2b0
             ,0x103);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_1a0._M_allocated_capacity);
  local_2c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/dbwrapper_tests.cpp"
  ;
  local_2b8 = "";
  local_2d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2c8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x104;
  file_00.m_begin = (iterator)&local_2c0;
  msg_00.m_end = pvVar11;
  msg_00.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_2d0,
             msg_00);
  _cVar13 = 0x38034a;
  local_1b0[0] = (class_property<bool>)
                 CDBWrapper::Read<unsigned_char,uint256>
                           ((CDBWrapper *)
                            dbw._M_t.
                            super___uniq_ptr_impl<CDBWrapper,_std::default_delete<CDBWrapper>_>._M_t
                            .super__Tuple_impl<0UL,_CDBWrapper_*,_std::default_delete<CDBWrapper>_>.
                            super__Head_base<0UL,_CDBWrapper_*,_false>._M_head_impl,&key,&res);
  local_1b0._8_8_ = (element_type *)0x0;
  aStack_1a0._M_allocated_capacity = 0;
  local_268._0_8_ = "dbw->Read(key, res)";
  local_268.m_message.px = (element_type *)0xe5d4ca;
  odbw.m_name._M_dataplus._M_p._0_1_ = 0;
  odbw.m_db_context._M_t.super___uniq_ptr_impl<LevelDBContext,_std::default_delete<LevelDBContext>_>
  ._M_t.super__Tuple_impl<0UL,_LevelDBContext_*,_std::default_delete<LevelDBContext>_>.
  super__Head_base<0UL,_LevelDBContext_*,_false>._M_head_impl =
       (__uniq_ptr_data<LevelDBContext,_std::default_delete<LevelDBContext>,_true,_true>)
       &PTR__lazy_ostream_01389048;
  odbw.m_name._M_string_length = (size_type)boost::unit_test::lazy_ostream::inst;
  local_2e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/dbwrapper_tests.cpp"
  ;
  local_2d8 = "";
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x0;
  odbw.m_name.field_2._M_allocated_capacity = (size_type)&local_268;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_1b0,(lazy_ostream *)&odbw,1,0,WARN,_cVar13,(size_t)&local_2e0
             ,0x104);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_1a0._M_allocated_capacity);
  local_2f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/dbwrapper_tests.cpp"
  ;
  local_2e8 = "";
  local_300 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2f8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x105;
  file_01.m_begin = (iterator)&local_2f0;
  msg_01.m_end = pvVar11;
  msg_01.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_300,
             msg_01);
  local_268.m_message.px = (element_type *)((ulong)local_268.m_message.px & 0xffffffffffffff00);
  local_268._0_8_ = &PTR__lazy_ostream_01388f08;
  local_268.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_250 = (string **)0xf4aea1;
  base_blob<256u>::ToString_abi_cxx11_((string *)&res2,&res);
  base_blob<256u>::ToString_abi_cxx11_((string *)&in2,&in);
  if (res2.super_base_blob<256U>.m_data._M_elems._8_8_ ==
      in2.super_base_blob<256U>.m_data._M_elems._8_8_) {
    if (res2.super_base_blob<256U>.m_data._M_elems._8_8_ == 0) {
      bVar12 = true;
    }
    else {
      iVar7 = bcmp((void *)res2.super_base_blob<256U>.m_data._M_elems._0_8_,
                   (void *)in2.super_base_blob<256U>.m_data._M_elems._0_8_,
                   res2.super_base_blob<256U>.m_data._M_elems._8_8_);
      bVar12 = iVar7 == 0;
    }
  }
  else {
    bVar12 = false;
  }
  res3.super_base_blob<256U>.m_data._M_elems[0] = bVar12;
  res3.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  local_400._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/dbwrapper_tests.cpp"
  ;
  local_400._8_8_ = "";
  odbw.m_name.field_2._M_allocated_capacity = (size_type)local_1f8;
  odbw.m_name._M_dataplus._M_p._0_1_ = 0;
  odbw.m_db_context._M_t.super___uniq_ptr_impl<LevelDBContext,_std::default_delete<LevelDBContext>_>
  ._M_t.super__Tuple_impl<0UL,_LevelDBContext_*,_std::default_delete<LevelDBContext>_>.
  super__Head_base<0UL,_LevelDBContext_*,_false>._M_head_impl =
       (__uniq_ptr_data<LevelDBContext,_std::default_delete<LevelDBContext>,_true,_true>)
       &PTR__lazy_ostream_01388fc8;
  odbw.m_name._M_string_length = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_1a0._8_8_ = local_218;
  local_218._0_8_ = &in2;
  local_1b0._8_8_ = local_1b0._8_8_ & 0xffffffffffffff00;
  local_1b0._0_8_ = &PTR__lazy_ostream_01388fc8;
  aStack_1a0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x2;
  local_1f8._0_8_ = (string *)&res2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&res3,(lazy_ostream *)&local_268,1,2,REQUIRE,0xe5d479,
             (size_t)local_400,0x105,&odbw,"in.ToString()",(assertion_result *)local_1b0);
  boost::detail::shared_count::~shared_count
            ((shared_count *)(res3.super_base_blob<256U>.m_data._M_elems + 0x10));
  if ((uchar *)in2.super_base_blob<256U>.m_data._M_elems._0_8_ !=
      in2.super_base_blob<256U>.m_data._M_elems + 0x10) {
    operator_delete((void *)in2.super_base_blob<256U>.m_data._M_elems._0_8_,
                    in2.super_base_blob<256U>.m_data._M_elems._16_8_ + 1);
  }
  if ((uchar *)res2.super_base_blob<256U>.m_data._M_elems._0_8_ !=
      res2.super_base_blob<256U>.m_data._M_elems + 0x10) {
    operator_delete((void *)res2.super_base_blob<256U>.m_data._M_elems._0_8_,
                    res2.super_base_blob<256U>.m_data._M_elems._16_8_ + 1);
  }
  this_00._M_t.super___uniq_ptr_impl<CDBWrapper,_std::default_delete<CDBWrapper>_>._M_t.
  super__Tuple_impl<0UL,_CDBWrapper_*,_std::default_delete<CDBWrapper>_>.
  super__Head_base<0UL,_CDBWrapper_*,_false>._M_head_impl =
       dbw._M_t.super___uniq_ptr_impl<CDBWrapper,_std::default_delete<CDBWrapper>_>._M_t.
       super__Tuple_impl<0UL,_CDBWrapper_*,_std::default_delete<CDBWrapper>_>.
       super__Head_base<0UL,_CDBWrapper_*,_false>._M_head_impl;
  dbw._M_t.super___uniq_ptr_impl<CDBWrapper,_std::default_delete<CDBWrapper>_>._M_t.
  super__Tuple_impl<0UL,_CDBWrapper_*,_std::default_delete<CDBWrapper>_>.
  super__Head_base<0UL,_CDBWrapper_*,_false>._M_head_impl =
       (__uniq_ptr_data<CDBWrapper,_std::default_delete<CDBWrapper>,_true,_true>)
       (__uniq_ptr_impl<CDBWrapper,_std::default_delete<CDBWrapper>_>)0x0;
  if ((__uniq_ptr_impl<CDBWrapper,_std::default_delete<CDBWrapper>_>)
      this_00._M_t.super___uniq_ptr_impl<CDBWrapper,_std::default_delete<CDBWrapper>_>._M_t.
      super__Tuple_impl<0UL,_CDBWrapper_*,_std::default_delete<CDBWrapper>_>.
      super__Head_base<0UL,_CDBWrapper_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<CDBWrapper,_std::default_delete<CDBWrapper>_>)0x0) {
    CDBWrapper::~CDBWrapper
              ((CDBWrapper *)
               this_00._M_t.super___uniq_ptr_impl<CDBWrapper,_std::default_delete<CDBWrapper>_>._M_t
               .super__Tuple_impl<0UL,_CDBWrapper_*,_std::default_delete<CDBWrapper>_>.
               super__Head_base<0UL,_CDBWrapper_*,_false>._M_head_impl);
    operator_delete((void *)this_00._M_t.
                            super___uniq_ptr_impl<CDBWrapper,_std::default_delete<CDBWrapper>_>._M_t
                            .super__Tuple_impl<0UL,_CDBWrapper_*,_std::default_delete<CDBWrapper>_>.
                            super__Head_base<0UL,_CDBWrapper_*,_false>._M_head_impl,0x70);
  }
  std::filesystem::__cxx11::path::path((path *)local_1b0,&ph.super_path);
  local_188 = 0x400;
  local_180._0_1_ = false;
  local_180._1_1_ = true;
  local_180._2_1_ = true;
  local_180._3_1_ = false;
  CDBWrapper::CDBWrapper(&odbw,(DBParams *)local_1b0);
  std::filesystem::__cxx11::path::~path((path *)local_1b0);
  res2.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  local_310 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/dbwrapper_tests.cpp"
  ;
  local_308 = "";
  local_320 = &boost::unit_test::basic_cstring<char_const>::null;
  local_318 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x10f;
  file_02.m_begin = (iterator)&local_310;
  msg_02.m_end = pvVar11;
  msg_02.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_320,
             msg_02);
  _cVar13 = 0x3806bd;
  bVar12 = CDBWrapper::Read<unsigned_char,uint256>(&odbw,&key,&res2);
  local_268.m_message.px = (element_type *)0x0;
  local_268.m_message.pn.pi_ = (sp_counted_base *)0x0;
  in2.super_base_blob<256U>.m_data._M_elems._0_8_ = anon_var_dwarf_839332;
  in2.super_base_blob<256U>.m_data._M_elems._8_8_ = (long)"!odbw.Read(key, res2)" + 0x15;
  local_1b0._8_8_ = local_1b0._8_8_ & 0xffffffffffffff00;
  local_1b0._0_8_ = &PTR__lazy_ostream_01389048;
  aStack_1a0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_1a0._8_8_ = &in2;
  local_330 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/dbwrapper_tests.cpp"
  ;
  local_328 = "";
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x0;
  local_268.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)!bVar12;
  boost::test_tools::tt_detail::report_assertion
            (&local_268,(lazy_ostream *)local_1b0,1,0,WARN,_cVar13,(size_t)&local_330,0x10f);
  boost::detail::shared_count::~shared_count(&local_268.m_message.pn);
  local_340 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/dbwrapper_tests.cpp"
  ;
  local_338 = "";
  local_350 = &boost::unit_test::basic_cstring<char_const>::null;
  local_348 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x110;
  file_03.m_begin = (iterator)&local_340;
  msg_03.m_end = pvVar11;
  msg_03.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_350,
             msg_03);
  _cVar13 = 0x380784;
  pvVar8 = dbwrapper_private::GetObfuscateKey(&odbw);
  puVar2 = (pvVar8->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar3 = (pvVar8->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (puVar3 == puVar2) {
    local_268.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(class_property<bool>)0x0;
  }
  else {
    bVar6 = 1;
    uVar9 = 0;
    do {
      bVar6 = bVar6 & puVar2[uVar9] == '\0';
      uVar9 = uVar9 + 1;
    } while ((uVar9 & 0xffffffff) < (ulong)((long)puVar3 - (long)puVar2));
    local_268.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(bVar6 ^ 1);
  }
  local_268.m_message.px = (element_type *)0x0;
  local_268.m_message.pn.pi_ = (sp_counted_base *)0x0;
  in2.super_base_blob<256U>.m_data._M_elems._0_8_ = anon_var_dwarf_83933e;
  in2.super_base_blob<256U>.m_data._M_elems._8_8_ =
       (long)"!is_null_key(dbwrapper_private::GetObfuscateKey(odbw))" + 0x36;
  local_1b0._8_8_ = local_1b0._8_8_ & 0xffffffffffffff00;
  local_1b0._0_8_ = &PTR__lazy_ostream_01389048;
  aStack_1a0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_1a0._8_8_ = &in2;
  local_360 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/dbwrapper_tests.cpp"
  ;
  local_358 = "";
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_268,(lazy_ostream *)local_1b0,1,0,WARN,_cVar13,(size_t)&local_360,0x110);
  boost::detail::shared_count::~shared_count(&local_268.m_message.pn);
  in2.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  in2.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  in2.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  in2.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  in2.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  in2.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  in2.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  in2.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  in2.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  in2.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  in2.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  in2.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  in2.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  in2.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  in2.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  in2.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  in2.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  in2.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  in2.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  in2.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  in2.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  in2.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  in2.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  in2.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  in2.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  in2.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  in2.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  in2.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  in2.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  in2.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  in2.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  in2.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  output_00.m_size = 0x20;
  output_00.m_data = (byte *)&in2;
  FastRandomContext::fillrand(this_02,output_00);
  res3.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  local_370 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/dbwrapper_tests.cpp"
  ;
  local_368 = "";
  local_380 = &boost::unit_test::basic_cstring<char_const>::null;
  local_378 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x116;
  file_04.m_begin = (iterator)&local_370;
  msg_04.m_end = pvVar11;
  msg_04.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_380,
             msg_04);
  _cVar13 = 0x3808b8;
  local_268.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)CDBWrapper::Write<unsigned_char,uint256>(&odbw,&key,&in2,false);
  local_268.m_message.px = (element_type *)0x0;
  local_268.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_400._0_8_ = "odbw.Write(key, in2)";
  local_400._8_8_ = "";
  local_1b0._8_8_ = local_1b0._8_8_ & 0xffffffffffffff00;
  local_1b0._0_8_ = &PTR__lazy_ostream_01389048;
  aStack_1a0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_1a0._8_8_ = local_400;
  local_390 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/dbwrapper_tests.cpp"
  ;
  local_388 = "";
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_268,(lazy_ostream *)local_1b0,1,0,WARN,_cVar13,(size_t)&local_390,0x116);
  boost::detail::shared_count::~shared_count(&local_268.m_message.pn);
  local_3a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/dbwrapper_tests.cpp"
  ;
  local_398 = "";
  local_3b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3a8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x117;
  file_05.m_begin = (iterator)&local_3a0;
  msg_05.m_end = pvVar11;
  msg_05.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_3b0,
             msg_05);
  _cVar13 = 0x380982;
  local_268.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)CDBWrapper::Read<unsigned_char,uint256>(&odbw,&key,&res3);
  local_268.m_message.px = (element_type *)0x0;
  local_268.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_400._0_8_ = "odbw.Read(key, res3)";
  local_400._8_8_ = "";
  local_1b0._8_8_ = local_1b0._8_8_ & 0xffffffffffffff00;
  local_1b0._0_8_ = &PTR__lazy_ostream_01389048;
  aStack_1a0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_1a0._8_8_ = local_400;
  local_3c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/dbwrapper_tests.cpp"
  ;
  local_3b8 = "";
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_268,(lazy_ostream *)local_1b0,1,0,WARN,_cVar13,(size_t)&local_3c0,0x117);
  boost::detail::shared_count::~shared_count(&local_268.m_message.pn);
  local_3d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/dbwrapper_tests.cpp"
  ;
  local_3c8 = "";
  local_3e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3d8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0x118;
  file_06.m_begin = (iterator)&local_3d0;
  msg_06.m_end = pvVar11;
  msg_06.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_3e0,
             msg_06);
  local_400._8_8_ = local_400._8_8_ & 0xffffffffffffff00;
  local_400._0_8_ = &PTR__lazy_ostream_01388f08;
  local_3f0 = boost::unit_test::lazy_ostream::inst;
  local_3e8 = "";
  base_blob<256u>::ToString_abi_cxx11_((string *)local_1f8,&res3);
  base_blob<256u>::ToString_abi_cxx11_((string *)local_218,&in2);
  if (local_1f8._8_8_ == local_218._8_8_) {
    if (local_1f8._8_8_ == 0) {
      local_230.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(class_property<bool>)0x1;
    }
    else {
      iVar7 = bcmp((void *)local_1f8._0_8_,(void *)local_218._0_8_,local_1f8._8_8_);
      local_230.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(iVar7 == 0);
    }
  }
  else {
    local_230.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(class_property<bool>)0x0;
  }
  local_230.m_message.px = (element_type *)0x0;
  local_230.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_240 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/dbwrapper_tests.cpp"
  ;
  local_238 = "";
  aStack_1a0._8_8_ = &local_248;
  local_1b0._8_8_ = local_1b0._8_8_ & 0xffffffffffffff00;
  local_1b0._0_8_ = &PTR__lazy_ostream_01388fc8;
  aStack_1a0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_250 = &local_270;
  local_268.m_message.px = (element_type *)((ulong)local_268.m_message.px & 0xffffffffffffff00);
  local_268._0_8_ = &PTR__lazy_ostream_01388fc8;
  local_268.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_270 = (string *)local_218;
  local_248 = (string *)local_1f8;
  boost::test_tools::tt_detail::report_assertion
            (&local_230,(lazy_ostream *)local_400,1,2,REQUIRE,0xe5d515,(size_t)&local_240,0x118,
             (lazy_ostream *)local_1b0,"in2.ToString()",&local_268);
  boost::detail::shared_count::~shared_count(&local_230.m_message.pn);
  if ((uint256 *)local_218._0_8_ != (uint256 *)(local_218 + 0x10)) {
    operator_delete((void *)local_218._0_8_,local_218._16_8_ + 1);
  }
  if ((string *)local_1f8._0_8_ != (string *)(local_1f8 + 0x10)) {
    operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
  }
  CDBWrapper::~CDBWrapper(&odbw);
  std::unique_ptr<CDBWrapper,_std::default_delete<CDBWrapper>_>::~unique_ptr(&dbw);
  std::filesystem::__cxx11::path::~path(&ph.super_path);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(existing_data_reindex)
{
    // We're going to share this fs::path between two wrappers
    fs::path ph = m_args.GetDataDirBase() / "existing_data_reindex";
    fs::create_directories(ph);

    // Set up a non-obfuscated wrapper to write some initial data.
    std::unique_ptr<CDBWrapper> dbw = std::make_unique<CDBWrapper>(DBParams{.path = ph, .cache_bytes = 1 << 10, .memory_only = false, .wipe_data = false, .obfuscate = false});
    uint8_t key{'k'};
    uint256 in = m_rng.rand256();
    uint256 res;

    BOOST_CHECK(dbw->Write(key, in));
    BOOST_CHECK(dbw->Read(key, res));
    BOOST_CHECK_EQUAL(res.ToString(), in.ToString());

    // Call the destructor to free leveldb LOCK
    dbw.reset();

    // Simulate a -reindex by wiping the existing data store
    CDBWrapper odbw({.path = ph, .cache_bytes = 1 << 10, .memory_only = false, .wipe_data = true, .obfuscate = true});

    // Check that the key/val we wrote with unobfuscated wrapper doesn't exist
    uint256 res2;
    BOOST_CHECK(!odbw.Read(key, res2));
    BOOST_CHECK(!is_null_key(dbwrapper_private::GetObfuscateKey(odbw)));

    uint256 in2 = m_rng.rand256();
    uint256 res3;

    // Check that we can write successfully
    BOOST_CHECK(odbw.Write(key, in2));
    BOOST_CHECK(odbw.Read(key, res3));
    BOOST_CHECK_EQUAL(res3.ToString(), in2.ToString());
}